

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLPrinter::Print(XMLPrinter *this,char *format,...)

{
  void **ppvVar1;
  int iVar2;
  char in_AL;
  int iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  ppvVar1 = &va[0].overflow_arg_area;
  local_108 = 0x3000000010;
  local_100 = ppvVar1;
  local_f8 = local_e8;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((FILE *)this->_fp == (FILE *)0x0) {
    iVar3 = vsnprintf((char *)0x0,0,format,&local_108);
    local_108 = 0x3000000010;
    local_100 = ppvVar1;
    local_f8 = local_e8;
    DynArray<char,_20>::EnsureCapacity(&this->_buffer,(this->_buffer)._size + iVar3);
    iVar2 = (this->_buffer)._size;
    (this->_buffer)._size = iVar2 + iVar3;
    vsnprintf((this->_buffer)._mem + (long)iVar2 + -1,(long)(iVar3 + 1),format,&local_108);
  }
  else {
    vfprintf((FILE *)this->_fp,format,&local_108);
  }
  return;
}

Assistant:

void XMLPrinter::Print(const char* format, ...)
{
    va_list va;
    va_start(va, format);

    if (_fp) {
        vfprintf(_fp, format, va);
    } else {
        const int len = TIXML_VSCPRINTF(format, va);
        // Close out and re-start the va-args
        va_end(va);
        TIXMLASSERT(len >= 0);
        va_start(va, format);
        TIXMLASSERT(_buffer.Size() > 0 && _buffer[_buffer.Size() - 1] == 0);
        char* p = _buffer.PushArr(len) - 1; // back up over the null terminator.
        TIXML_VSNPRINTF(p, len + 1, format, va);
    }
    va_end(va);
}